

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

cl_int clEnqueueMemsetINTEL_EMU
                 (cl_command_queue queue,void *dst_ptr,cl_int value,size_t size,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  cl_int cVar1;
  SConfig *pSVar2;
  cl_icd_dispatch *pcVar3;
  size_t in_RCX;
  void *in_RSI;
  cl_command_queue in_RDI;
  cl_uint in_R8D;
  cl_event *in_R9;
  cl_event *in_stack_00000008;
  cl_uchar pattern;
  CLIntercept *pIntercept;
  undefined1 local_41;
  CLIntercept *local_40;
  cl_event *local_38;
  cl_uint local_2c;
  size_t local_28;
  void *local_18;
  cl_command_queue local_10;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = GetIntercept();
  if (((local_40 != (CLIntercept *)0x0) &&
      (pSVar2 = CLIntercept::config(local_40),
      (pSVar2->Emulate_cl_intel_unified_shared_memory & 1U) != 0)) &&
     (pcVar3 = CLIntercept::dispatch(local_40),
     pcVar3->clEnqueueSVMMemFill != (cl_api_clEnqueueSVMMemFill)0x0)) {
    pcVar3 = CLIntercept::dispatch(local_40);
    cVar1 = (*pcVar3->clEnqueueSVMMemFill)
                      (local_10,local_18,&local_41,1,local_28,local_2c,local_38,in_stack_00000008);
    return cVar1;
  }
  return -0x3b;
}

Assistant:

cl_int CL_API_CALL clEnqueueMemsetINTEL_EMU(   // Deprecated
    cl_command_queue queue,
    void* dst_ptr,
    cl_int value,
    size_t size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory &&
        pIntercept->dispatch().clEnqueueSVMMemFill )
    {
        const cl_uchar  pattern = (cl_uchar)value;
        return pIntercept->dispatch().clEnqueueSVMMemFill(
            queue,
            dst_ptr,
            &pattern,
            sizeof(pattern),
            size,
            num_events_in_wait_list,
            event_wait_list,
            event );
    }

    return CL_INVALID_OPERATION;
}